

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_sink_test.cc
# Opt level: O1

void __thiscall
google::protobuf::io::zc_sink_internal::anon_unknown_0::ZeroCopyStreamByteSinkTest_WriteShort_Test::
TestBody(ZeroCopyStreamByteSinkTest_WriteShort_Test *this)

{
  ChunkedString *this_00;
  char cVar1;
  ulong uVar2;
  char *message;
  string_view sVar3;
  ScopedTrace gtest_trace_167;
  ScopedTrace gtest_trace_163;
  ScopedTrace gtest_trace_159;
  ZeroCopyStreamByteSink byte_sink;
  ChunkedString input;
  AssertionResult gtest_ar;
  ScopedTrace local_11b;
  ScopedTrace local_11a;
  ScopedTrace local_119;
  string local_118;
  ZeroCopyStreamByteSink local_f8;
  ZeroCopyStreamByteSinkTest_WriteShort_Test *local_d0;
  basic_string_view<char,_std::char_traits<char>_> *local_c8;
  array<char,_10UL> *local_c0;
  ChunkedString local_b8;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  uint64_t uStack_70;
  size_t local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  void *local_50;
  undefined8 uStack_48;
  long local_40;
  undefined8 uStack_38;
  
  this_00 = &(this->super_ZeroCopyStreamByteSinkTest).output_chunks_;
  local_c0 = &(this->super_ZeroCopyStreamByteSinkTest).output_;
  local_c8 = &(this->super_ZeroCopyStreamByteSinkTest).output_view_;
  local_d0 = this;
  while( true ) {
    zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
              ((string *)local_90,this_00);
    testing::ScopedTrace::ScopedTrace
              (&local_119,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
               ,0x9f,(string *)local_90);
    if (local_90 != (undefined1  [8])&aStack_80) {
      operator_delete((void *)local_90,(ulong)(aStack_80._M_allocated_capacity + 1));
    }
    local_b8.data_._M_len = 9;
    local_b8.data_._M_str = "012345678";
    local_b8.skipped_patterns_ = 1;
    local_b8.pattern_ = 0;
    do {
      local_b8.pattern_bit_idx_ = 0;
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                ((string *)local_90,&local_b8);
      testing::ScopedTrace::ScopedTrace
                (&local_11a,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xa3,(string *)local_90);
      if (local_90 != (undefined1  [8])&aStack_80) {
        operator_delete((void *)local_90,(ulong)(aStack_80._M_allocated_capacity + 1));
      }
      local_c0->_M_elems[8] = '\0';
      local_c0->_M_elems[9] = '\0';
      local_c0->_M_elems[0] = '\0';
      local_c0->_M_elems[1] = '\0';
      local_c0->_M_elems[2] = '\0';
      local_c0->_M_elems[3] = '\0';
      local_c0->_M_elems[4] = '\0';
      local_c0->_M_elems[5] = '\0';
      local_c0->_M_elems[6] = '\0';
      local_c0->_M_elems[7] = '\0';
      local_68 = (this->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_bit_idx_;
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this_00->data_)._M_len;
      aStack_80._M_allocated_capacity =
           (size_type)(this->super_ZeroCopyStreamByteSinkTest).output_chunks_.data_._M_str;
      aStack_80._8_8_ = (this->super_ZeroCopyStreamByteSinkTest).output_chunks_.skipped_patterns_;
      uStack_70 = (this->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_;
      local_90 = (undefined1  [8])&PTR__PatternedOutputStream_0194a790;
      local_40 = 0;
      uStack_38 = 0;
      local_50 = (void *)0x0;
      uStack_48 = 0;
      local_60 = 0;
      uStack_58 = 0;
      local_f8.bytes_written_._0_1_ = 0;
      local_f8._25_8_ = 0;
      local_f8.buffer_ = (char *)0x0;
      local_f8.buffer_size_._0_1_ = 0;
      local_f8.buffer_size_._1_7_ = 0;
      local_f8.stream_ = (ZeroCopyOutputStream *)local_90;
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                (&local_118,&local_b8);
      testing::ScopedTrace::ScopedTrace
                (&local_11b,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xa7,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      while( true ) {
        sVar3 = ChunkedString::NextChunk(&local_b8);
        if (sVar3._M_len == 0) break;
        ZeroCopyStreamByteSink::Append(&local_f8,sVar3._M_str,sVar3._M_len);
      }
      testing::ScopedTrace::~ScopedTrace(&local_11b);
      if (CONCAT71(local_f8.buffer_size_._1_7_,(undefined1)local_f8.buffer_size_) != 0) {
        (**(code **)(((_Alloc_hider *)&(local_f8.stream_)->_vptr_ZeroCopyOutputStream)->_M_p + 0x18)
        )();
      }
      local_90 = (undefined1  [8])&PTR__PatternedOutputStream_0194a790;
      if (local_50 != (void *)0x0) {
        operator_delete(local_50,local_40 - (long)local_50);
      }
      testing::ScopedTrace::~ScopedTrace(&local_11a);
      local_b8.pattern_ = local_b8.pattern_ + local_b8.skipped_patterns_;
    } while (local_b8.pattern_ < (ulong)(long)(1 << ((byte)local_b8.data_._M_len & 0x1f)));
    local_f8.stream_ = (ZeroCopyOutputStream *)&DAT_0000000a;
    local_f8.buffer_ = "012345678";
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              ((internal *)local_90,"output_view_","absl::string_view(\"012345678\\0\", 10)",
               local_c8,(basic_string_view<char,_std::char_traits<char>_> *)&local_f8);
    cVar1 = local_90[0];
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)&local_f8);
      message = anon_var_dwarf_a12c75 + 5;
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xae,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
      if ((string *)local_f8.stream_ != (string *)0x0) {
        (**(code **)(((_Alloc_hider *)&(local_f8.stream_)->_vptr_ZeroCopyOutputStream)->_M_p + 8))()
        ;
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    testing::ScopedTrace::~ScopedTrace(&local_119);
    if ((cVar1 == '\0') ||
       (uVar2 = (local_d0->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_ +
                (local_d0->super_ZeroCopyStreamByteSinkTest).output_chunks_.skipped_patterns_,
       (local_d0->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_ = uVar2,
       (ulong)(long)(1 << ((byte)(local_d0->super_ZeroCopyStreamByteSinkTest).output_chunks_.data_.
                                 _M_len & 0x1f)) <= uVar2)) break;
    (local_d0->super_ZeroCopyStreamByteSinkTest).output_chunks_.pattern_bit_idx_ = 0;
  }
  return;
}

Assistant:

TEST_F(ZeroCopyStreamByteSinkTest, WriteShort) {
  do {
    SCOPED_TRACE(output_chunks_.PatternAsQuotedString());
    ChunkedString input("012345678", 1);

    do {
      SCOPED_TRACE(input.PatternAsQuotedString());
      output_ = {};
      PatternedOutputStream output_stream(output_chunks_);
      ZeroCopyStreamByteSink byte_sink(&output_stream);
      SCOPED_TRACE(input.PatternAsQuotedString());
      absl::string_view chunk;
      while (!(chunk = input.NextChunk()).empty()) {
        byte_sink.Append(chunk.data(), chunk.size());
      }
    } while (input.NextPattern());

    ASSERT_EQ(output_view_, absl::string_view("012345678\0", 10));
  } while (output_chunks_.NextPattern());
}